

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O3

bool __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
::insert_media(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
               *this,Media *media)

{
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  shared_ptr<Storage::Tape::Tape> local_38;
  
  psVar1 = (media->tapes).
           super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (media->tapes).
           super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = psVar1 != psVar2;
  if (bVar3) {
    local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (psVar1->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (psVar1->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
         _M_pi;
    if (local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Storage::Tape::TapePlayer::set_tape((TapePlayer *)&this->tape_player_,&local_38);
    if (local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_38.super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if ((media->disks).
      super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (media->disks).
      super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = insert_disks<Oric::BD500>(this,media,&this->bd500_,4);
    bVar3 = bVar3 || psVar1 != psVar2;
  }
  return bVar3;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			bool inserted = false;

			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
				inserted = true;
			}

			if(!media.disks.empty()) {
				switch(disk_interface) {
					case DiskInterface::BD500:		inserted |= insert_disks(media, bd500_, 4);		break;
					case DiskInterface::Jasmin:		inserted |= insert_disks(media, jasmin_, 4);	break;
					case DiskInterface::Microdisc:	inserted |= insert_disks(media, microdisc_, 4);	break;
					case DiskInterface::Pravetz:	inserted |= insert_disks(media, *diskii_.last_valid(), 2);	break;
					default: break;
				}
			}

			return inserted;
		}